

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O3

LLVMValueRef
CompileArgument(LlvmCompilationContext *ctx,TypeBase *argumentType,LLVMValueRef argument)

{
  return argument;
}

Assistant:

LLVMValueRef CompileArgument(LlvmCompilationContext& ctx, TypeBase *argumentType, LLVMValueRef argument)
{
	if (IsStructArgumentType(argumentType))
	{
		LLVMValueRef storage = LLVMBuildAlloca(ctx.builder, CompileLlvmType(ctx, argumentType), "");

		LLVMSetAlignment(storage, 16);

		LLVMBuildStore(ctx.builder, argument, storage);

		return storage;
	}

	return argument;
}